

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_j2k_t * j2k_create_decompress(opj_common_ptr cinfo)

{
  opj_tcp_t *poVar1;
  opj_common_ptr in_RDI;
  opj_j2k_t *j2k;
  opj_j2k_t *local_8;
  
  local_8 = (opj_j2k_t *)calloc(1,0x78);
  if (local_8 == (opj_j2k_t *)0x0) {
    local_8 = (opj_j2k_t *)0x0;
  }
  else {
    poVar1 = (opj_tcp_t *)calloc(1,0x15e8);
    local_8->default_tcp = poVar1;
    if (local_8->default_tcp == (opj_tcp_t *)0x0) {
      free(local_8);
      local_8 = (opj_j2k_t *)0x0;
    }
    else {
      local_8->cinfo = in_RDI;
      local_8->tile_data = (uchar **)0x0;
    }
  }
  return local_8;
}

Assistant:

opj_j2k_t* j2k_create_decompress(opj_common_ptr cinfo) {
	opj_j2k_t *j2k = (opj_j2k_t*) opj_calloc(1, sizeof(opj_j2k_t));
	if(!j2k)
		return NULL;

	j2k->default_tcp = (opj_tcp_t*) opj_calloc(1, sizeof(opj_tcp_t));
	if(!j2k->default_tcp) {
		opj_free(j2k);
		return NULL;
	}

	j2k->cinfo = cinfo;
	j2k->tile_data = NULL;

	return j2k;
}